

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

quaternion * quaternion_rotate_by_axis_angle_EXP(quaternion *self,vector3 *axis,double angle)

{
  quaternion *pqVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  quaternion qT;
  anon_union_32_3_07544b10_for_quaternion_0 local_30;
  double local_10;
  
  dVar5 = (axis->field_0).v[0];
  dVar4 = (axis->field_0).v[1];
  dVar7 = (axis->field_0).v[2];
  local_10 = angle * 0.5;
  dVar2 = sin(local_10);
  dVar3 = cos(local_10);
  dVar5 = dVar5 * dVar2;
  dVar4 = dVar4 * dVar2;
  dVar7 = dVar7 * dVar2;
  dVar2 = dVar3 * dVar3 + dVar7 * dVar7 + dVar5 * dVar5 + dVar4 * dVar4;
  local_30.q[0] = dVar5;
  local_30.q[1] = dVar4;
  local_30.q[2] = dVar7;
  local_30.q[3] = dVar3;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar6 = -dVar2;
  if (-dVar2 <= dVar2) {
    dVar6 = dVar2;
  }
  if (1e-05 <= dVar6) {
    local_30.q[0] = dVar5 / dVar2;
    local_30.q[1] = dVar4 / dVar2;
    local_30.q[2] = dVar7 / dVar2;
    local_30.q[3] = dVar3 / dVar2;
  }
  quaternion_multiply(self,(quaternion *)&local_30.field_1);
  pqVar1 = quaternion_normalize(self);
  return pqVar1;
}

Assistant:

HYPAPI struct quaternion *quaternion_rotate_by_axis_angle_EXP(struct quaternion *self, const struct vector3 *axis, HYP_FLOAT angle)
{
	struct quaternion qT;

	quaternion_set_from_axis_anglev3(&qT, axis, angle);
	quaternion_rotate_by_quaternion_EXP(self, &qT);

	return self;
}